

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void __thiscall MD5::final(MD5 *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t local_68;
  ulong padLen;
  ulong index;
  ulong oldCount [2];
  ulong oldState [4];
  byte bits [8];
  MD5 *this_local;
  
  uVar1 = this->_state[0];
  oldState[0] = this->_state[1];
  uVar2 = this->_count[0];
  encode(this,this->_count,(byte *)(oldState + 3),8);
  uVar3 = this->_count[0] >> 3 & 0x3f;
  if (uVar3 < 0x38) {
    local_68 = 0x38 - uVar3;
  }
  else {
    local_68 = 0x78 - uVar3;
  }
  update(this,PADDING,local_68);
  update(this,(byte *)(oldState + 3),8);
  encode(this,this->_state,this->_digest,0x10);
  this->_state[0] = uVar1;
  this->_state[1] = oldState[0];
  this->_count[0] = uVar2;
  return;
}

Assistant:

void MD5::final()
{

    byte bits[8];
    ulong oldState[4];
    ulong oldCount[2];
    ulong index, padLen;

    /* Save current state and count. */
    memcpy(oldState, _state, 16);
    memcpy(oldCount, _count, 8);

    /* Save number of bits */
    encode(_count, bits, 8);

    /* Pad out to 56 mod 64. */
    index = (ulong) ((_count[0] >> 3) & 0x3f);
    padLen = (index < 56) ? (56 - index) : (120 - index);
    update(PADDING, padLen);

    /* Append length (before padding) */
    update(bits, 8);

    /* Store state in digest */
    encode(_state, _digest, 16);

    /* Restore current state and count. */
    memcpy(_state, oldState, 16);
    memcpy(_count, oldCount, 8);
}